

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O2

bool __thiscall ON_NurbsSurface::GetCV(ON_NurbsSurface *this,int i,int j,ON_4dPoint *point)

{
  uint uVar1;
  bool bVar2;
  double *pdVar3;
  double dVar4;
  
  bVar2 = false;
  if (-1 < (j | i)) {
    uVar1 = this->m_dim;
    bVar2 = false;
    if (((0 < (int)uVar1) && (bVar2 = false, i < this->m_cv_count[0])) && (j < this->m_cv_count[1]))
    {
      pdVar3 = CV(this,i,j);
      if (pdVar3 == (double *)0x0) {
        bVar2 = false;
      }
      else {
        point->x = *pdVar3;
        if (uVar1 < 2) {
          point->y = 0.0;
          dVar4 = 0.0;
        }
        else {
          point->y = pdVar3[1];
          dVar4 = 0.0;
          if (uVar1 != 2) {
            dVar4 = pdVar3[2];
          }
        }
        point->z = dVar4;
        if (this->m_is_rat == 0) {
          dVar4 = 1.0;
        }
        else {
          dVar4 = pdVar3[uVar1];
        }
        point->w = dVar4;
        bVar2 = true;
      }
    }
  }
  return bVar2;
}

Assistant:

bool 
ON_NurbsSurface::GetCV( int i, int j, ON_4dPoint& point ) const
{
  bool rc = false;
  if (m_dim > 0 && i >= 0 && j >= 0 && i < m_cv_count[0] && j < m_cv_count[1])
  {
    const double* cv = CV(i, j);
    if (cv) {
      point.x = cv[0];
      point.y = (m_dim > 1) ? cv[1] : 0.0;
      point.z = (m_dim > 2) ? cv[2] : 0.0;
      point.w = (m_is_rat) ? cv[m_dim] : 1.0;
      rc = true;
    }
  }
  return rc;
}